

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc-posix.c
# Opt level: O3

int mi_reallocarr(void *p,size_t count,size_t size)

{
  int iVar1;
  void *pvVar2;
  int *piVar3;
  
  if (p == (void *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    iVar1 = 0x16;
  }
  else {
    pvVar2 = mi_reallocn(*p,count,size);
    if (pvVar2 == (void *)0x0) {
      piVar3 = __errno_location();
      *piVar3 = 0xc;
      iVar1 = 0xc;
    }
    else {
      *(void **)p = pvVar2;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

mi_decl_nodiscard int mi_reallocarr( void* p, size_t count, size_t size ) mi_attr_noexcept { // NetBSD
  mi_assert(p != NULL);
  if (p == NULL) {
    errno = EINVAL;
    return EINVAL;
  }
  void** op = (void**)p;
  void* newp = mi_reallocarray(*op, count, size);
  if mi_unlikely(newp == NULL) { return errno; }